

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O1

void Exa3_ManExactSynthesis(Bmc_EsPar_t *pPars)

{
  uint *puVar1;
  ulong *puVar2;
  word wVar3;
  Bmc_EsPar_t *pBVar4;
  Vec_Bit_t *pVVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  Exa3_Man_t *p;
  Vec_Wec_t *pVVar12;
  Vec_Int_t *pVVar13;
  ulong uVar14;
  Vec_Wrd_t *pVVar15;
  word *pwVar16;
  int *piVar17;
  void *pvVar18;
  bmcg_sat_solver *s;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int (*paiVar24) [32];
  int (*paiVar25) [32];
  ulong uVar26;
  int (*paaiVar27) [6] [32];
  int iVar28;
  uint uVar29;
  ulong uVar30;
  word *__s;
  char *pcVar31;
  ulong uVar32;
  timespec *plits;
  long lVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  undefined4 uVar37;
  uint uVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  bool bVar42;
  byte bVar43;
  bool bVar44;
  char cVar45;
  timespec ts;
  word pTruth [16];
  int *local_208;
  int (*local_200) [6] [32];
  long local_1f8;
  long local_1f0;
  int (*local_1e8) [6] [32];
  int (*local_1e0) [6] [32];
  int (*local_1d0) [6] [32];
  int (*local_1b8) [32];
  long local_1b0;
  timespec local_198 [8];
  ulong local_118;
  ulong local_110;
  long local_108;
  ulong local_100;
  uint local_f8 [16];
  ulong local_b8 [17];
  
  iVar6 = clock_gettime(3,local_198);
  if (iVar6 < 0) {
    local_1b0 = -1;
  }
  else {
    local_1b0 = CONCAT44(local_198[0].tv_nsec._4_4_,(uint)local_198[0].tv_nsec) / 1000 +
                CONCAT44(local_198[0].tv_sec._4_4_,(uint)local_198[0].tv_sec) * 1000000;
  }
  Abc_TtReadHex(local_b8,pPars->pTtStr);
  iVar6 = pPars->nVars;
  local_200 = (int (*) [6] [32])(long)iVar6;
  if (10 < (long)local_200) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x523,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  iVar20 = pPars->nLutSize;
  if (6 < iVar20) {
    __assert_fail("pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x524,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  p = (Exa3_Man_t *)calloc(1,0x60e0);
  p->pPars = pPars;
  p->nVars = iVar6;
  iVar7 = pPars->nNodes;
  p->nNodes = iVar7;
  p->nLutSize = iVar20;
  uVar36 = ~(-1 << ((byte)iVar20 & 0x1f));
  p->LutMask = uVar36;
  iVar28 = iVar7 + iVar6;
  p->nObjs = iVar28;
  iVar20 = 1 << ((char)iVar6 - 6U & 0x1f);
  if (iVar6 < 7) {
    iVar20 = 1;
  }
  p->nWords = iVar20;
  p->pTruth = local_b8;
  pVVar12 = (Vec_Wec_t *)malloc(0x10);
  iVar20 = 8;
  if (6 < (iVar7 + iVar6) - 1U) {
    iVar20 = iVar28;
  }
  pVVar12->nSize = 0;
  pVVar12->nCap = iVar20;
  if (iVar20 == 0) {
    pVVar13 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar13 = (Vec_Int_t *)calloc((long)iVar20,0x10);
  }
  pVVar12->pArray = pVVar13;
  pVVar12->nSize = iVar28;
  p->vOutLits = pVVar12;
  if (0x20 < iVar28) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x39b,"int Exa3_ManMarkup(Exa3_Man_t *)");
  }
  p->iVar = uVar36 * iVar7 + 1;
  if (0 < iVar7) {
    local_1e0 = p->VarMarks + (long)local_200;
    do {
      uVar14 = (ulong)(uint)p->nLutSize;
      if (0 < p->nLutSize) {
        lVar39 = 0;
        paaiVar27 = local_1e0;
        do {
          if (pPars->fFewerVars == 0) {
            lVar40 = 0;
LAB_005a2d34:
            for (; lVar40 < (long)local_200 - lVar39; lVar40 = lVar40 + 1) {
              iVar6 = p->iVar;
              if (iVar6 < 0) goto LAB_005a46a1;
              Vec_WecPush(pVVar12,(int)lVar40,iVar6 * 2);
              p->iVar = iVar6 + 1;
              (*paaiVar27)[0][lVar40] = iVar6;
            }
          }
          else {
            iVar6 = p->nObjs;
            if (lVar39 != 0 || iVar6 + -1 != (int)local_200) {
              lVar40 = (long)(int)((int)uVar14 + ~(uint)lVar39);
              goto LAB_005a2d34;
            }
            iVar20 = p->iVar;
            if (iVar20 < 0) goto LAB_005a46a1;
            Vec_WecPush(pVVar12,iVar6 + -2,iVar20 * 2);
            p->iVar = iVar20 + 1;
            p->VarMarks[(long)local_200 + -1][5][(long)iVar6 + 0x1e] = iVar20;
          }
          lVar39 = lVar39 + 1;
          uVar14 = (ulong)p->nLutSize;
          paaiVar27 = (int (*) [6] [32])(*paaiVar27 + 1);
        } while (lVar39 < (long)uVar14);
      }
      local_200 = (int (*) [6] [32])((long)local_200 + 1);
      local_1e0 = local_1e0 + 1;
    } while ((long)local_200 < (long)p->nObjs);
  }
  iVar6 = p->iVar;
  pwVar16 = (word *)0x0;
  printf("The number of parameter variables = %d.\n");
  lVar40 = (long)p->nWords;
  iVar20 = p->nObjs;
  lVar39 = ((long)iVar20 + 1) * lVar40;
  pVVar15 = (Vec_Wrd_t *)malloc(0x10);
  iVar7 = (int)lVar39;
  iVar28 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar28 = iVar7;
  }
  pVVar15->nSize = 0;
  pVVar15->nCap = iVar28;
  if (iVar28 != 0) {
    pwVar16 = (word *)malloc((long)iVar28 << 3);
  }
  pVVar15->pArray = pwVar16;
  pVVar15->nSize = iVar7;
  memset(pwVar16,0,lVar39 * 8);
  p->vInfo = pVVar15;
  iVar7 = p->nVars;
  if (0 < (long)iVar7) {
    uVar36 = 1 << ((char)iVar7 - 6U & 0x1f);
    if (iVar7 < 7) {
      uVar36 = 1;
    }
    uVar14 = 0;
    do {
      if (((long)(uVar14 * lVar40) < 0) || (lVar39 <= (long)(uVar14 * lVar40))) goto LAB_005a46df;
      if (uVar14 < 6) {
        if (0 < (int)uVar36) {
          wVar3 = s_Truths6[uVar14];
          uVar32 = 0;
          do {
            pwVar16[uVar32] = wVar3;
            uVar32 = uVar32 + 1;
          } while (uVar36 != uVar32);
        }
      }
      else if (0 < (int)uVar36) {
        uVar32 = 0;
        do {
          pwVar16[uVar32] = -(ulong)((1 << ((char)uVar14 - 6U & 0x1f) & (uint)uVar32) != 0);
          uVar32 = uVar32 + 1;
        } while (uVar36 != uVar32);
      }
      uVar14 = uVar14 + 1;
      pwVar16 = pwVar16 + lVar40;
    } while (uVar14 != (long)iVar7);
  }
  p->vInfo = pVVar15;
  if (pPars->nLutSize == 3) {
    uVar36 = iVar20 * iVar20 * iVar20 * (pPars->nNodes << ((byte)pPars->nVars & 0x1f));
    iVar20 = (((int)uVar36 >> 5) + 1) - (uint)((uVar36 & 0x1f) == 0);
    piVar17 = (int *)malloc(0x10);
    piVar17[1] = 0;
    *piVar17 = iVar20 * 0x20;
    if (iVar20 == 0) {
      pvVar18 = (void *)0x0;
    }
    else {
      pvVar18 = malloc((long)iVar20 << 2);
    }
    *(void **)(piVar17 + 2) = pvVar18;
    piVar17[1] = iVar20 * 0x20;
    lVar39 = 0x40;
LAB_005a2fc9:
    memset(pvVar18,0,(long)iVar20 << 2);
    *(int **)((long)(p->VarMarks + -1) + 0x2b8 + lVar39) = piVar17;
  }
  else if (pPars->nLutSize == 2) {
    uVar36 = iVar20 * iVar20 * (pPars->nNodes << ((byte)pPars->nVars & 0x1f));
    iVar20 = (((int)uVar36 >> 5) + 1) - (uint)((uVar36 & 0x1f) == 0);
    piVar17 = (int *)malloc(0x10);
    piVar17[1] = 0;
    *piVar17 = iVar20 * 0x20;
    if (iVar20 == 0) {
      pvVar18 = (void *)0x0;
    }
    else {
      pvVar18 = malloc((long)iVar20 << 2);
    }
    *(void **)(piVar17 + 2) = pvVar18;
    piVar17[1] = iVar20 * 0x20;
    lVar39 = 0x38;
    goto LAB_005a2fc9;
  }
  s = bmcg_sat_solver_start();
  p->pSat = s;
  bmcg_sat_solver_set_nvars(s,iVar6);
  if (pPars->RuntimeLim != 0) {
    iVar6 = clock_gettime(3,local_198);
    if (iVar6 < 0) {
      lVar39 = -1;
    }
    else {
      lVar39 = CONCAT44(local_198[0].tv_nsec._4_4_,(uint)local_198[0].tv_nsec) / 1000 +
               CONCAT44(local_198[0].tv_sec._4_4_,(uint)local_198[0].tv_sec) * 1000000;
    }
    bmcg_sat_solver_set_runtime_limit(s,(long)pPars->RuntimeLim * 1000000 + lVar39);
  }
  if (((local_b8[0] & 1) != 0) && (iVar6 = p->nWords, 0 < (long)iVar6)) {
    lVar39 = 0;
    do {
      local_b8[lVar39] = ~local_b8[lVar39];
      lVar39 = lVar39 + 1;
    } while (iVar6 != lVar39);
  }
  lVar39 = (long)p->nVars;
  local_100 = local_b8[0];
  if (p->nObjs <= p->nVars) {
LAB_005a3570:
    iVar6 = 1;
    if (p->nObjs < 2) {
      bVar42 = false;
    }
    else {
      lVar39 = 8;
      lVar40 = 0;
      do {
        if (p->vOutLits->nSize <= lVar40) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar13 = p->vOutLits->pArray;
        iVar20 = *(int *)((long)pVVar13 + lVar39 + -4);
        if (iVar20 < 1) {
          __assert_fail("Vec_IntSize(vArray) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                        ,0x49d,"int Exa3_ManAddCnfStart(Exa3_Man_t *, int)");
        }
        iVar20 = bmcg_sat_solver_addclause(p->pSat,*(int **)((long)&pVVar13->nCap + lVar39),iVar20);
        bVar42 = iVar20 == 0;
        if (bVar42) {
          iVar6 = 0;
          break;
        }
        lVar40 = lVar40 + 1;
        lVar39 = lVar39 + 0x10;
      } while (lVar40 < (long)p->nObjs + -1);
    }
LAB_005a35ef:
    if (bVar42) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                    ,0x528,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
    }
    uVar36 = 0;
    printf("Running exact synthesis for %d-input function with %d %d-input LUTs...\n",
           (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes,(ulong)(uint)p->nLutSize);
    if (pPars->fUseIncr != 0) {
      bmcg_sat_solver_set_nvars(p->pSat,(p->nNodes << ((byte)p->nVars & 0x1f)) + p->iVar);
      iVar20 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
      iVar6 = 1;
      if (iVar20 != 1) {
        __assert_fail("status == GLUCOSE_SAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                      ,0x52e,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
      }
    }
    bVar42 = false;
    uVar14 = 1;
    do {
      uVar38 = (uint)uVar14;
      if (pPars->fUseIncr == 0) {
        uVar32 = p->pTruth[(int)uVar38 >> 6];
        iVar20 = p->nVars;
        if (0 < (long)iVar20) {
          lVar39 = 0;
          do {
            p->VarVals[lVar39] = (uint)((uVar38 >> ((uint)lVar39 & 0x1f) & 1) != 0);
            lVar39 = lVar39 + 1;
          } while (iVar20 != lVar39);
        }
        bmcg_sat_solver_set_nvars(p->pSat,(p->nLutSize + 1) * p->nNodes + p->iVar);
        local_1e0 = (int (*) [6] [32])(long)p->nVars;
        if (p->nVars < p->nObjs) {
          do {
            iVar7 = (int)local_1e0;
            iVar28 = iVar7 - p->nVars;
            iVar20 = p->LutMask;
            uVar29 = p->iVar;
            local_110 = (ulong)uVar29;
            uVar11 = (p->nLutSize + 1) * iVar28;
            local_118 = (ulong)uVar11;
            iVar10 = uVar11 + uVar29;
            if (0 < p->nLutSize) {
              local_108 = (long)iVar10;
              iVar8 = uVar29 * 2 + uVar11 * 2;
              local_1f8 = 0;
              do {
                if (0 < p->nObjs) {
                  lVar39 = local_108 + local_1f8;
                  lVar40 = 0;
                  do {
                    if (p->VarMarks[(long)local_1e0][local_1f8][lVar40] != 0) {
                      iVar22 = p->iVar;
                      iVar19 = p->nVars;
                      iVar23 = p->nLutSize + 1;
                      iVar21 = 0;
                      do {
                        iVar9 = p->VarMarks[(long)local_1e0][local_1f8][lVar40];
                        if ((iVar9 < 0) || (local_198[0].tv_sec._0_4_ = iVar9 * 2 + 1, lVar39 < 0))
                        goto LAB_005a46a1;
                        local_198[0].tv_sec._4_4_ = iVar8 + iVar21;
                        if (lVar40 < p->nVars) {
                          iVar9 = 2;
                          bVar43 = 0x10;
                          if (iVar21 != p->VarVals[lVar40]) goto LAB_005a3c97;
                        }
                        else {
                          if (((int)lVar40 - iVar19) * iVar23 + iVar22 + p->nLutSize < 0)
                          goto LAB_005a46a1;
                          local_198[0].tv_nsec._0_4_ =
                               iVar21 + (p->nLutSize + ((int)lVar40 - iVar19) * iVar23 + iVar22) * 2
                               ^ 1;
                          iVar9 = 3;
LAB_005a3c97:
                          iVar9 = bmcg_sat_solver_addclause(p->pSat,(int *)local_198,iVar9);
                          bVar43 = iVar9 == 0;
                        }
                        if ((bVar43 & 0xf) != 0) goto LAB_005a3cc1;
                        iVar21 = iVar21 + 1;
                      } while (iVar21 == 1);
                      bVar43 = 0;
LAB_005a3cc1:
                      if (bVar43 != 0) goto LAB_005a4270;
                    }
                    lVar40 = lVar40 + 1;
                  } while (lVar40 < p->nObjs);
                }
                local_1f8 = local_1f8 + 1;
                iVar8 = iVar8 + 2;
              } while (local_1f8 < p->nLutSize);
            }
            iVar22 = (int)local_110;
            iVar8 = (int)local_118;
            uVar29 = 0;
            do {
              if (((p->nObjs + -1 != iVar7) || (uVar29 != ((uVar32 >> (uVar14 & 0x3f) & 1) != 0)))
                 && (-1 < p->LutMask)) {
                uVar11 = 0;
                do {
                  cVar45 = '\x16';
                  if (uVar29 != 1 || uVar11 != 0) {
                    iVar19 = p->nLutSize;
                    if ((long)iVar19 < 1) {
                      uVar35 = 0;
                      iVar23 = 0;
                    }
                    else {
                      uVar30 = 0;
                      iVar21 = iVar22 * 2 + iVar8 * 2;
                      do {
                        if ((int)(iVar10 + (uint)uVar30) < 0) goto LAB_005a46a1;
                        uVar35 = uVar30 + 1;
                        *(uint *)((long)&local_198[0].tv_sec + uVar30 * 4) =
                             iVar21 + (uint)((uVar11 >> ((uint)uVar30 & 0x1f) & 1) != 0);
                        iVar21 = iVar21 + 2;
                        uVar30 = uVar35;
                        iVar23 = iVar19;
                      } while ((long)iVar19 != uVar35);
                    }
                    iVar21 = (int)uVar35;
                    if (p->nObjs + -1 != iVar7) {
                      if (iVar23 + iVar10 < 0) goto LAB_005a46a1;
                      iVar21 = iVar21 + 1;
                      *(uint *)((long)&local_198[0].tv_sec + (uVar35 & 0xffffffff) * 4) =
                           uVar29 + (iVar23 + iVar10) * 2 ^ 1;
                    }
                    if (uVar11 != 0) {
                      iVar23 = uVar11 + iVar20 * iVar28;
                      if (iVar23 < 0) goto LAB_005a46a1;
                      lVar39 = (long)iVar21;
                      iVar21 = iVar21 + 1;
                      *(uint *)((long)&local_198[0].tv_sec + lVar39 * 4) = uVar29 + iVar23 * 2;
                    }
                    if (iVar19 + 2 < iVar21) {
                      __assert_fail("nLits <= p->nLutSize+2",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                                    ,0x4d5,"int Exa3_ManAddCnf(Exa3_Man_t *, int)");
                    }
                    iVar19 = bmcg_sat_solver_addclause(p->pSat,(int *)local_198,iVar21);
                    cVar45 = iVar19 == 0;
                  }
                  if ((cVar45 != '\x16') && (cVar45 != '\0')) goto LAB_005a4270;
                  bVar44 = (int)uVar11 < p->LutMask;
                  uVar11 = uVar11 + 1;
                } while (bVar44);
              }
              bVar44 = uVar29 == 0;
              uVar29 = uVar29 + 1;
            } while (bVar44);
            local_1e0 = (int (*) [6] [32])((long)local_1e0 + 1);
          } while ((long)local_1e0 < (long)p->nObjs);
        }
        p->iVar = p->iVar + (p->nLutSize + 1) * p->nNodes;
      }
      else {
        iVar7 = p->nNodes * uVar38 + p->iVar;
        uVar32 = p->pTruth[(int)uVar38 >> 6];
        iVar20 = p->nVars;
        lVar39 = (long)iVar20;
        if (0 < lVar39) {
          lVar40 = 0;
          do {
            p->VarVals[lVar40] = (uint)((uVar38 >> ((uint)lVar40 & 0x1f) & 1) != 0);
            lVar40 = lVar40 + 1;
          } while (lVar39 != lVar40);
        }
        if (iVar20 < p->nObjs) {
          local_200 = p->VarMarks + lVar39;
          do {
            iVar20 = p->nVars;
            iVar10 = (int)lVar39;
            iVar28 = p->LutMask;
            if (0 < p->nLutSize) {
              lVar40 = 0;
              paaiVar27 = local_200;
              do {
                uVar29 = 0;
                if (p->nObjs < 1) {
                  uVar37 = 0xffffffff;
                }
                else {
                  uVar30 = 0xffffffff;
                  uVar35 = 0;
                  do {
                    iVar8 = (*paaiVar27)[0][uVar35];
                    if (iVar8 != 0) {
                      iVar8 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar8);
                      if (iVar8 != 0) {
                        uVar30 = uVar35 & 0xffffffff;
                      }
                      uVar29 = uVar29 + (iVar8 != 0);
                    }
                    uVar37 = (undefined4)uVar30;
                    uVar35 = uVar35 + 1;
                  } while ((long)uVar35 < (long)p->nObjs);
                  uVar29 = (uint)(uVar29 == 1);
                }
                if ((char)uVar29 == '\0') goto LAB_005a46fe;
                *(undefined4 *)((long)&local_198[0].tv_sec + lVar40 * 4) = uVar37;
                lVar40 = lVar40 + 1;
                paaiVar27 = (int (*) [6] [32])(*paaiVar27 + 1);
              } while (lVar40 < p->nLutSize);
            }
            pBVar4 = p->pPars;
            if (pBVar4->nLutSize == 2) {
              iVar8 = pBVar4->nNodes;
              iVar22 = pBVar4->nVars;
              p->nUsed[0] = p->nUsed[0] + 1;
              if ((((int)(uint)local_198[0].tv_sec <= (int)local_198[0].tv_sec._4_4_) ||
                  (lVar39 <= (int)local_198[0].tv_sec._4_4_)) ||
                 (lVar39 <= (int)(uint)local_198[0].tv_sec)) {
                __assert_fail("i < n && j < n && i < j",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                              ,0x370,"int Exa3_ManIsUsed2(Exa3_Man_t *, int, int, int, int)");
              }
              uVar29 = (((iVar8 * uVar38 + iVar10) - iVar22) * p->nObjs + local_198[0].tv_sec._4_4_)
                       * p->nObjs + (uint)local_198[0].tv_sec;
              if (((int)uVar29 < 0) || (pVVar5 = p->vUsed2, pVVar5->nSize <= (int)uVar29))
              goto LAB_005a475b;
              piVar17 = pVVar5->pArray;
              bVar43 = 7;
              if (((uint)piVar17[uVar29 >> 5] >> (uVar29 & 0x1f) & 1) == 0) {
                p->nUsed[1] = p->nUsed[1] + 1;
                if (pVVar5->nSize <= (int)uVar29) goto LAB_005a4815;
                puVar1 = (uint *)(piVar17 + (uVar29 >> 5));
                *puVar1 = *puVar1 | 1 << ((byte)uVar29 & 0x1f);
                goto LAB_005a3848;
              }
            }
            else {
LAB_005a3848:
              if (pBVar4->nLutSize == 3) {
                iVar8 = pBVar4->nNodes;
                iVar22 = pBVar4->nVars;
                iVar19 = p->nObjs;
                p->nUsed[0] = p->nUsed[0] + 1;
                if (((((int)(uint)local_198[0].tv_sec <= (int)local_198[0].tv_sec._4_4_) ||
                     ((int)local_198[0].tv_sec._4_4_ <= (int)(uint)local_198[0].tv_nsec)) ||
                    (lVar39 <= (int)(uint)local_198[0].tv_nsec)) ||
                   ((lVar39 <= (int)local_198[0].tv_sec._4_4_ ||
                    (lVar39 <= (int)(uint)local_198[0].tv_sec)))) {
                  __assert_fail("i < n && j < n && k < n && i < j && j < k",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                                ,0x37c,"int Exa3_ManIsUsed3(Exa3_Man_t *, int, int, int, int, int)")
                  ;
                }
                uVar29 = ((((iVar8 * uVar38 + iVar10) - iVar22) * iVar19 +
                          (uint)local_198[0].tv_nsec) * iVar19 + local_198[0].tv_sec._4_4_) * iVar19
                         + (uint)local_198[0].tv_sec;
                if (((int)uVar29 < 0) || (pVVar5 = p->vUsed3, pVVar5->nSize <= (int)uVar29)) {
LAB_005a475b:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                                ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
                }
                piVar17 = pVVar5->pArray;
                bVar43 = 7;
                if (((uint)piVar17[uVar29 >> 5] >> (uVar29 & 0x1f) & 1) != 0) goto LAB_005a3aa0;
                p->nUsed[1] = p->nUsed[1] + 1;
                if (pVVar5->nSize <= (int)uVar29) {
LAB_005a4815:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                }
                puVar1 = (uint *)(piVar17 + (uVar29 >> 5));
                *puVar1 = *puVar1 | 1 << ((byte)uVar29 & 0x1f);
              }
              uVar29 = 0;
              do {
                if (((p->nObjs + -1 != iVar10) || (uVar29 != ((uVar32 >> (uVar14 & 0x3f) & 1) != 0))
                    ) && (-1 < p->LutMask)) {
                  uVar11 = 0;
                  do {
                    bVar43 = 0x10;
                    if (uVar29 != 1 || uVar11 != 0) {
                      iVar8 = p->nLutSize;
                      uVar35 = (ulong)iVar8;
                      bVar44 = 0 < (long)uVar35;
                      if ((long)uVar35 < 1) {
                        iVar22 = 0;
                      }
                      else {
                        uVar30 = 0;
                        bVar44 = true;
                        iVar22 = 0;
                        paaiVar27 = local_200;
                        do {
                          iVar19 = *(int *)((long)&local_198[0].tv_sec + uVar30 * 4);
                          iVar23 = (*paaiVar27)[0][iVar19];
                          if (iVar23 < 0) goto LAB_005a46a1;
                          iVar21 = iVar22 + 1;
                          local_f8[iVar22] = iVar23 * 2 + 1;
                          if (iVar19 < p->nVars) {
                            iVar22 = iVar21;
                            if (p->VarVals[iVar19] !=
                                (uint)((uVar11 >> ((uint)uVar30 & 0x1f) & 1) != 0)) break;
                          }
                          else {
                            iVar19 = (iVar19 + iVar7) - p->nVars;
                            if (iVar19 < 0) goto LAB_005a46a1;
                            iVar22 = iVar22 + 2;
                            local_f8[iVar21] =
                                 (uint)((uVar11 >> ((uint)uVar30 & 0x1f) & 1) != 0) + iVar19 * 2;
                          }
                          uVar30 = uVar30 + 1;
                          bVar44 = uVar30 < uVar35;
                          paaiVar27 = (int (*) [6] [32])(*paaiVar27 + 1);
                        } while (uVar35 != uVar30);
                      }
                      if (!bVar44) {
                        if (p->nObjs + -1 != iVar10) {
                          iVar19 = (iVar10 + iVar7) - p->nVars;
                          if (iVar19 < 0) goto LAB_005a46a1;
                          lVar40 = (long)iVar22;
                          iVar22 = iVar22 + 1;
                          local_f8[lVar40] = uVar29 + iVar19 * 2 ^ 1;
                        }
                        if (uVar11 != 0) {
                          iVar19 = uVar11 + (iVar10 - iVar20) * iVar28;
                          if (iVar19 < 0) goto LAB_005a46a1;
                          lVar40 = (long)iVar22;
                          iVar22 = iVar22 + 1;
                          local_f8[lVar40] = uVar29 + iVar19 * 2;
                        }
                        if (iVar8 * 2 + 2 < iVar22) {
                          __assert_fail("nLits <= 2*p->nLutSize+2",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                                        ,0x50c,"int Exa3_ManAddCnf2(Exa3_Man_t *, int)");
                        }
                        iVar8 = bmcg_sat_solver_addclause(p->pSat,(int *)local_f8,iVar22);
                        bVar43 = iVar8 == 0;
                      }
                    }
                    if ((bVar43 & 0xf) != 0) goto LAB_005a3aa0;
                    bVar44 = (int)uVar11 < p->LutMask;
                    uVar11 = uVar11 + 1;
                  } while (bVar44);
                }
                bVar44 = uVar29 == 0;
                uVar29 = uVar29 + 1;
              } while (bVar44);
              bVar43 = 0;
            }
LAB_005a3aa0:
            if ((bVar43 != 7) && (bVar43 != 0)) goto LAB_005a4270;
            lVar39 = lVar39 + 1;
            local_200 = local_200 + 1;
          } while (lVar39 < p->nObjs);
        }
      }
      iVar6 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
      if ((pPars->fVerbose != 0) && ((pPars->fUseIncr == 0 || (uVar36 == (uVar36 / 100) * 100)))) {
        iVar20 = clock_gettime(3,local_198);
        if (iVar20 < 0) {
          lVar39 = -1;
        }
        else {
          lVar39 = CONCAT44(local_198[0].tv_nsec._4_4_,(uint)local_198[0].tv_nsec) / 1000 +
                   CONCAT44(local_198[0].tv_sec._4_4_,(uint)local_198[0].tv_sec) * 1000000;
        }
        Exa3_ManPrint(p,uVar36,uVar38,lVar39 - local_1b0);
      }
      if (iVar6 + 1U < 2) goto LAB_005a4270;
      lVar39 = (long)p->nVars;
      iVar20 = p->nObjs;
      if (p->nVars < iVar20) {
        local_1e8 = p->VarMarks + lVar39;
        do {
          iVar20 = p->nVars;
          iVar28 = (int)lVar39;
          iVar7 = p->LutMask;
          if (0 < p->nLutSize) {
            lVar40 = 0;
            paaiVar27 = local_1e8;
            do {
              uVar38 = 0;
              if (p->nObjs < 1) {
                iVar10 = -1;
              }
              else {
                uVar14 = 0xffffffff;
                uVar32 = 0;
                do {
                  iVar10 = (*paaiVar27)[0][uVar32];
                  if (iVar10 != 0) {
                    iVar10 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar10);
                    if (iVar10 != 0) {
                      uVar14 = uVar32 & 0xffffffff;
                    }
                    uVar38 = uVar38 + (iVar10 != 0);
                  }
                  iVar10 = (int)uVar14;
                  uVar32 = uVar32 + 1;
                } while ((long)uVar32 < (long)p->nObjs);
                uVar38 = (uint)(uVar38 == 1);
              }
              if ((char)uVar38 == '\0') goto LAB_005a46fe;
              uVar38 = iVar10 * p->nWords;
              if (((int)uVar38 < 0) || (p->vInfo->nSize <= (int)uVar38)) goto LAB_005a46df;
              (&local_198[0].tv_sec)[lVar40] = (__time_t)(p->vInfo->pArray + uVar38);
              lVar40 = lVar40 + 1;
              paaiVar27 = (int (*) [6] [32])(*paaiVar27 + 1);
            } while (lVar40 < p->nLutSize);
          }
          uVar38 = p->nWords;
          uVar29 = uVar38 * iVar28;
          if (((int)uVar29 < 0) || (p->vInfo->nSize <= (int)uVar29)) goto LAB_005a46df;
          if (0 < (int)uVar38) {
            memset(p->vInfo->pArray + uVar29,0,(ulong)uVar38 << 3);
          }
          if (0 < p->LutMask) {
            uVar38 = 1;
            do {
              iVar10 = bmcg_sat_solver_read_cex_varvalue(p->pSat,uVar38 + (iVar28 - iVar20) * iVar7)
              ;
              if (iVar10 != 0) {
                uVar29 = p->nWords;
                uVar14 = (ulong)uVar29;
                uVar11 = p->nObjs * uVar29;
                if ((int)uVar11 < 0) goto LAB_005a46df;
                iVar10 = p->vInfo->nSize;
                if (iVar10 <= (int)uVar11) goto LAB_005a46df;
                pwVar16 = p->vInfo->pArray;
                __s = pwVar16 + uVar11;
                if (0 < (int)uVar29) {
                  memset(__s,0xff,uVar14 * 8);
                }
                iVar8 = p->nLutSize;
                if (0 < (long)iVar8) {
                  lVar40 = 0;
                  do {
                    lVar33 = (&local_198[0].tv_sec)[lVar40];
                    if ((uVar38 >> ((uint)lVar40 & 0x1f) & 1) == 0) {
                      if (0 < (int)uVar29) {
                        uVar32 = 0;
                        do {
                          __s[uVar32] = __s[uVar32] & ~*(ulong *)(lVar33 + uVar32 * 8);
                          uVar32 = uVar32 + 1;
                        } while (uVar14 != uVar32);
                      }
                    }
                    else if (0 < (int)uVar29) {
                      uVar32 = 0;
                      do {
                        __s[uVar32] = __s[uVar32] & *(ulong *)(lVar33 + uVar32 * 8);
                        uVar32 = uVar32 + 1;
                      } while (uVar14 != uVar32);
                    }
                    lVar40 = lVar40 + 1;
                  } while (lVar40 != iVar8);
                }
                if (((int)(uVar29 * iVar28) < 0) || (iVar10 <= (int)(uVar29 * iVar28)))
                goto LAB_005a46df;
                if (0 < (int)uVar29) {
                  uVar32 = 0;
                  do {
                    puVar2 = pwVar16 + iVar28 * uVar29 + uVar32;
                    *puVar2 = *puVar2 | __s[uVar32];
                    uVar32 = uVar32 + 1;
                  } while (uVar14 != uVar32);
                }
              }
              bVar42 = (int)uVar38 < p->LutMask;
              uVar38 = uVar38 + 1;
            } while (bVar42);
          }
          lVar39 = lVar39 + 1;
          iVar20 = p->nObjs;
          local_1e8 = local_1e8 + 1;
        } while (lVar39 < iVar20);
      }
      uVar38 = (iVar20 + -1) * p->nWords;
      if (((int)uVar38 < 0) || (p->vInfo->nSize <= (int)uVar38)) {
LAB_005a46df:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      bVar43 = (byte)p->nVars;
      uVar29 = 1 << (bVar43 - 6 & 0x1f);
      if (p->nVars < 7) {
        uVar29 = 1;
      }
      uVar14 = 0xffffffff;
      if (0 < (int)uVar29) {
        iVar20 = 0;
        uVar32 = 0;
        do {
          uVar35 = p->vInfo->pArray[uVar38 + uVar32];
          if (uVar35 != p->pTruth[uVar32]) {
            uVar35 = p->pTruth[uVar32] ^ uVar35;
            bVar42 = (int)uVar35 == 0;
            uVar14 = uVar35 >> 0x20;
            if (!bVar42) {
              uVar14 = uVar35;
            }
            iVar28 = (uint)bVar42 * 0x20;
            iVar7 = iVar28 + 0x10;
            uVar32 = uVar14 >> 0x10;
            if ((short)uVar14 != 0) {
              iVar7 = iVar28;
              uVar32 = uVar14;
            }
            iVar28 = iVar7 + 8;
            uVar14 = uVar32 >> 8;
            if ((char)uVar32 != '\0') {
              iVar28 = iVar7;
              uVar14 = uVar32;
            }
            iVar7 = iVar28 + 4;
            uVar32 = uVar14 >> 4;
            if ((uVar14 & 0xf) != 0) {
              iVar7 = iVar28;
              uVar32 = uVar14;
            }
            uVar38 = (uint)(uVar32 >> 2) & 0x3fffffff;
            iVar28 = iVar7 + 2;
            if ((uVar32 & 3) != 0) {
              uVar38 = (uint)uVar32;
              iVar28 = iVar7;
            }
            uVar14 = (ulong)(((~uVar38 & 1) + iVar28) - iVar20);
            break;
          }
          uVar32 = uVar32 + 1;
          iVar20 = iVar20 + -0x40;
        } while (uVar29 != uVar32);
      }
      if (1 << (bVar43 & 0x1f) <= (int)uVar14) {
        __assert_fail("iMint < (1 << p->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                      ,0x415,"int Exa3_ManEval(Exa3_Man_t *)");
      }
      uVar36 = uVar36 + 1;
      bVar42 = (int)uVar14 == -1;
    } while (!bVar42);
    uVar38 = 0xffffffff;
LAB_005a4270:
    if ((pPars->fVerbose != 0) && (iVar6 != 0)) {
      iVar20 = clock_gettime(3,local_198);
      if (iVar20 < 0) {
        lVar39 = -1;
      }
      else {
        lVar39 = CONCAT44(local_198[0].tv_nsec._4_4_,(uint)local_198[0].tv_nsec) / 1000 +
                 CONCAT44(local_198[0].tv_sec._4_4_,(uint)local_198[0].tv_sec) * 1000000;
      }
      Exa3_ManPrint(p,uVar36,uVar38,lVar39 - local_1b0);
    }
    if (bVar42) {
      printf("Realization of given %d-input function using %d %d-input LUTs:\n",
             (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes,(ulong)(uint)p->nLutSize);
      local_200._0_4_ = p->nObjs;
      uVar14 = (ulong)(uint)p->nVars;
      if (p->nVars < (int)local_200) {
        local_1f0 = (long)p + (long)(int)local_200 * 0x300 + -0x338;
        lVar39 = (long)(int)local_200;
        do {
          local_200._0_4_ = (int)local_200 + -1;
          lVar40 = lVar39 + -1;
          iVar6 = p->LutMask;
          printf("%02d = %d\'b",lVar40,(ulong)(uint)(1 << ((byte)p->nLutSize & 0x1f)));
          uVar32 = local_100;
          if (0 < p->LutMask) {
            iVar20 = p->LutMask;
            do {
              uVar36 = bmcg_sat_solver_read_cex_varvalue
                                 (p->pSat,iVar20 + iVar6 * ((int)local_200 - (int)uVar14));
              uVar35 = (ulong)(uVar36 == 0);
              if (p->nObjs != (int)lVar39) {
                uVar35 = (ulong)uVar36;
              }
              if ((uVar32 & 1) == 0) {
                uVar35 = (ulong)uVar36;
              }
              printf("%d",uVar35);
              bVar42 = 1 < iVar20;
              iVar20 = iVar20 + -1;
            } while (bVar42);
          }
          pcVar31 = "0(";
          if (p->nObjs == (int)lVar39) {
            pcVar31 = "1(";
          }
          if ((uVar32 & 1) == 0) {
            pcVar31 = "0(";
          }
          printf(pcVar31);
          lVar39 = (long)p->nLutSize;
          if (0 < lVar39) {
            lVar33 = lVar39 * 0x80 + local_1f0;
            do {
              uVar36 = 0;
              if (p->nObjs < 1) {
                uVar38 = 0xffffffff;
              }
              else {
                uVar14 = 0xffffffff;
                uVar32 = 0;
                do {
                  iVar6 = *(int *)(lVar33 + uVar32 * 4);
                  if (iVar6 != 0) {
                    iVar6 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar6);
                    if (iVar6 != 0) {
                      uVar14 = uVar32 & 0xffffffff;
                    }
                    uVar36 = uVar36 + (iVar6 != 0);
                  }
                  uVar38 = (uint)uVar14;
                  uVar32 = uVar32 + 1;
                } while ((long)uVar32 < (long)p->nObjs);
                uVar36 = (uint)(uVar36 == 1);
              }
              if ((char)uVar36 == '\0') {
LAB_005a46fe:
                __assert_fail("Count == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                              ,0x3f8,"int Exa3_ManFindFanin(Exa3_Man_t *, int, int)");
              }
              if (((int)uVar38 < 0) || (p->nVars <= (int)uVar38)) {
                pcVar31 = " %02d";
              }
              else {
                uVar38 = uVar38 + 0x61;
                pcVar31 = " %c";
              }
              printf(pcVar31,(ulong)uVar38);
              lVar33 = lVar33 + -0x80;
              bVar42 = 1 < lVar39;
              lVar39 = lVar39 + -1;
            } while (bVar42);
          }
          puts(" )");
          uVar14 = (ulong)p->nVars;
          local_1f0 = local_1f0 + -0x300;
          lVar39 = lVar40;
        } while ((long)uVar14 < lVar40);
      }
    }
    else if (iVar6 == 0) {
      printf("The problem timed out after %d sec.\n",(ulong)(uint)pPars->RuntimeLim);
    }
    else {
      puts("The problem has no solution.");
    }
    printf("Added = %d.  Tried = %d.  ",(ulong)(uint)p->nUsed[1],(ulong)(uint)p->nUsed[0]);
    bmcg_sat_solver_stop(p->pSat);
    pVVar15 = p->vInfo;
    if (pVVar15->pArray != (word *)0x0) {
      free(pVVar15->pArray);
      pVVar15->pArray = (word *)0x0;
    }
    if (pVVar15 != (Vec_Wrd_t *)0x0) {
      free(pVVar15);
    }
    if (p->vUsed2 != (Vec_Bit_t *)0x0) {
      piVar17 = p->vUsed2->pArray;
      if (piVar17 != (int *)0x0) {
        free(piVar17);
        p->vUsed2->pArray = (int *)0x0;
      }
      if (p->vUsed2 != (Vec_Bit_t *)0x0) {
        free(p->vUsed2);
        p->vUsed2 = (Vec_Bit_t *)0x0;
      }
    }
    if (p->vUsed3 != (Vec_Bit_t *)0x0) {
      piVar17 = p->vUsed3->pArray;
      if (piVar17 != (int *)0x0) {
        free(piVar17);
        p->vUsed3->pArray = (int *)0x0;
      }
      if (p->vUsed3 != (Vec_Bit_t *)0x0) {
        free(p->vUsed3);
        p->vUsed3 = (Vec_Bit_t *)0x0;
      }
    }
    pVVar12 = p->vOutLits;
    if (0 < pVVar12->nCap) {
      lVar40 = 8;
      lVar39 = 0;
      do {
        pvVar18 = *(void **)((long)&pVVar12->pArray->nCap + lVar40);
        if (pvVar18 != (void *)0x0) {
          free(pvVar18);
          *(undefined8 *)((long)&pVVar12->pArray->nCap + lVar40) = 0;
        }
        lVar39 = lVar39 + 1;
        lVar40 = lVar40 + 0x10;
      } while (lVar39 < pVVar12->nCap);
    }
    if (pVVar12->pArray != (Vec_Int_t *)0x0) {
      free(pVVar12->pArray);
      pVVar12->pArray = (Vec_Int_t *)0x0;
    }
    pVVar12->nCap = 0;
    pVVar12->nSize = 0;
    free(pVVar12);
    if (p != (Exa3_Man_t *)0x0) {
      free(p);
    }
    iVar20 = 3;
    iVar6 = clock_gettime(3,local_198);
    if (iVar6 < 0) {
      lVar39 = -1;
    }
    else {
      lVar39 = CONCAT44(local_198[0].tv_nsec._4_4_,(uint)local_198[0].tv_nsec) / 1000 +
               CONCAT44(local_198[0].tv_sec._4_4_,(uint)local_198[0].tv_sec) * 1000000;
    }
    Abc_Print(iVar20,"%s =","Total runtime");
    Abc_Print(iVar20,"%9.2f sec\n",(double)(lVar39 - local_1b0) / 1000000.0);
    return;
  }
  iVar6 = pPars->fOnlyAnd;
  local_1d0 = p->VarMarks + lVar39;
  local_1b8 = p->VarMarks[lVar39] + 1;
LAB_005a30e1:
  iVar20 = ((int)lVar39 - p->nVars) * p->LutMask;
  if (0 < p->nLutSize) {
    uVar14 = 0;
    paiVar25 = local_1b8;
    paaiVar27 = local_1d0;
LAB_005a310d:
    plits = local_198;
    iVar7 = p->nObjs;
    if ((long)iVar7 < 1) {
      uVar32 = 0;
    }
    else {
      lVar40 = 0;
      uVar32 = 0;
      do {
        iVar28 = (*paaiVar27)[0][lVar40];
        if (iVar28 != 0) {
          if (iVar28 < 0) goto LAB_005a46a1;
          iVar10 = (int)uVar32;
          uVar32 = (ulong)(iVar10 + 1);
          *(int *)((long)&local_198[0].tv_sec + (long)iVar10 * 4) = iVar28 * 2;
        }
        lVar40 = lVar40 + 1;
      } while (iVar7 != lVar40);
    }
    if ((int)uVar32 < 1) {
      __assert_fail("nLits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                    ,0x45e,"int Exa3_ManAddCnfStart(Exa3_Man_t *, int)");
    }
    iVar7 = bmcg_sat_solver_addclause(p->pSat,(int *)plits,(int)uVar32);
    if (iVar7 == 0) {
      uVar36 = 1;
    }
    else {
      uVar35 = 0;
      uVar30 = uVar32;
      do {
        uVar26 = uVar35 + 1;
        if (uVar26 < uVar32) {
          uVar41 = 1;
          do {
            uVar36 = *(uint *)((long)&local_198[0].tv_sec + uVar35 * 4);
            if ((int)uVar36 < 0) {
LAB_005a46c0:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            local_f8[0] = uVar36 ^ 1;
            uVar36 = *(uint *)((long)&plits->tv_sec + uVar41 * 4);
            if ((int)uVar36 < 0) goto LAB_005a46c0;
            local_f8[1] = uVar36 ^ 1;
            iVar7 = bmcg_sat_solver_addclause(p->pSat,(int *)local_f8,2);
            if (iVar7 == 0) goto LAB_005a330e;
            uVar41 = uVar41 + 1;
          } while (uVar30 != uVar41);
        }
        uVar30 = uVar30 - 1;
        plits = (timespec *)((long)&plits->tv_sec + 4);
        uVar35 = uVar26;
      } while (uVar26 != uVar32);
      uVar36 = 5;
      if ((uVar14 != p->nLutSize - 1) && (uVar36 = 0, 0 < p->nObjs)) {
        lVar40 = 0;
        paiVar24 = paiVar25;
        do {
          if ((p->VarMarks[lVar39][uVar14][lVar40] != 0) && (lVar40 < p->nObjs)) {
            lVar33 = 0;
            do {
              iVar7 = (*paiVar24)[lVar33];
              if (iVar7 != 0) {
                iVar28 = p->VarMarks[lVar39][uVar14][lVar40];
                if ((iVar28 < 0) || (local_f8[0] = iVar28 * 2 + 1, iVar7 < 0)) goto LAB_005a46a1;
                local_f8[1] = iVar7 * 2 + 1;
                iVar7 = bmcg_sat_solver_addclause(p->pSat,(int *)local_f8,2);
                if (iVar7 == 0) goto LAB_005a330e;
              }
              lVar33 = lVar33 + 1;
            } while ((int)lVar33 + (int)lVar40 < p->nObjs);
          }
          lVar40 = lVar40 + 1;
          paiVar24 = (int (*) [32])(*paiVar24 + 1);
        } while (lVar40 < p->nObjs);
        uVar36 = 0;
      }
    }
    goto LAB_005a331a;
  }
LAB_005a3350:
  if ((p->pPars->fUseIncr != 0) && (lVar40 = (long)p->nVars, lVar40 < lVar39)) {
    local_208 = p->VarMarks[lVar40][0] + 1;
    do {
      if (0 < p->nObjs) {
        iVar7 = 1;
        lVar33 = 0;
        piVar17 = local_208;
        do {
          if ((p->VarMarks[lVar39][0][lVar33] != 0) && (lVar33 + 1 < (long)p->nObjs)) {
            lVar34 = 0;
            do {
              iVar28 = piVar17[lVar34];
              if (iVar28 != 0) {
                iVar10 = p->VarMarks[lVar39][0][lVar33];
                if ((iVar10 < 0) || (local_f8[0] = iVar10 * 2 + 1, iVar28 < 0)) goto LAB_005a46a1;
                local_f8[1] = iVar28 * 2 + 1;
                iVar28 = bmcg_sat_solver_addclause(p->pSat,(int *)local_f8,2);
                if (iVar28 == 0) goto LAB_005a353e;
              }
              lVar34 = lVar34 + 1;
            } while ((int)lVar34 + iVar7 < p->nObjs);
          }
          lVar33 = lVar33 + 1;
          iVar7 = iVar7 + 1;
          piVar17 = piVar17 + 1;
        } while (lVar33 < p->nObjs);
      }
      lVar40 = lVar40 + 1;
      local_208 = local_208 + 0xc0;
    } while (lVar40 < lVar39);
  }
  uVar36 = 0;
  if (p->nLutSize != 2) goto LAB_005a3543;
  if (iVar20 < -1) {
LAB_005a46a1:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar36 = iVar20 * 2 + 2;
  uVar38 = iVar20 * 2 + 6;
  iVar7 = 3;
  do {
    local_198[0].tv_sec._0_4_ = iVar7 == 2 | uVar36;
    local_198[0].tv_sec._4_4_ = (uint)(iVar7 == 1) | iVar20 * 2 + 4U;
    local_198[0].tv_nsec._0_4_ = iVar7 != 3 | uVar38;
    iVar28 = bmcg_sat_solver_addclause(p->pSat,(int *)local_198,3);
    if (iVar28 == 0) goto LAB_005a353e;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  if (iVar6 != 0) {
    local_198[0].tv_sec._0_4_ = uVar36 | 1;
    local_198[0].tv_sec._4_4_ = iVar20 * 2 + 5;
    local_198[0].tv_nsec._0_4_ = uVar38;
    iVar20 = bmcg_sat_solver_addclause(p->pSat,(int *)local_198,3);
    uVar36 = 1;
    if (iVar20 == 0) goto LAB_005a3543;
  }
  uVar36 = 0;
LAB_005a3543:
  if ((uVar36 & 3) != 0) {
    iVar6 = 0;
    bVar42 = true;
    goto LAB_005a35ef;
  }
  lVar39 = lVar39 + 1;
  local_1d0 = local_1d0 + 1;
  local_1b8 = local_1b8 + 6;
  if (p->nObjs <= lVar39) goto LAB_005a3570;
  goto LAB_005a30e1;
LAB_005a330e:
  uVar36 = 1;
LAB_005a331a:
  if (uVar36 != 0) {
    if (uVar36 != 5) goto LAB_005a3543;
    goto LAB_005a3350;
  }
  uVar14 = uVar14 + 1;
  paaiVar27 = (int (*) [6] [32])(*paaiVar27 + 1);
  paiVar25 = paiVar25 + 1;
  if ((long)p->nLutSize <= (long)uVar14) goto LAB_005a3350;
  goto LAB_005a310d;
LAB_005a353e:
  uVar36 = 1;
  goto LAB_005a3543;
}

Assistant:

void Exa3_ManExactSynthesis( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa3_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    assert( pPars->nLutSize <= 6 );
    p = Exa3_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa3_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d %d-input LUTs...\n", p->nVars, p->nNodes, p->nLutSize );
    if ( pPars->fUseIncr ) 
    {
        bmcg_sat_solver_set_nvars( p->pSat, p->iVar + p->nNodes*(1 << p->nVars) );
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        assert( status == GLUCOSE_SAT );
    }
    for ( i = 0; iMint != -1; i++ )
    {
        if ( pPars->fUseIncr ? !Exa3_ManAddCnf2( p, iMint ) : !Exa3_ManAddCnf( p, iMint ) )
            break;
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( pPars->fVerbose && (!pPars->fUseIncr || i % 100 == 0) )
            Exa3_ManPrint( p, i, iMint, Abc_Clock() - clkTotal );
        if ( status == GLUCOSE_UNSAT || status == GLUCOSE_UNDEC )
            break;
        iMint = Exa3_ManEval( p );
    }
    if ( pPars->fVerbose && status != GLUCOSE_UNDEC )
        Exa3_ManPrint( p, i, iMint, Abc_Clock() - clkTotal );
    if ( iMint == -1 )
        Exa3_ManPrintSolution( p, fCompl );
    else if ( status == GLUCOSE_UNDEC )
        printf( "The problem timed out after %d sec.\n", pPars->RuntimeLim );
    else 
        printf( "The problem has no solution.\n" );
    printf( "Added = %d.  Tried = %d.  ", p->nUsed[1], p->nUsed[0] );
    Exa3_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}